

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

string * __thiscall
cmsys::anon_unknown_3::SymbolProperties::GetFileName
          (string *__return_storage_ptr__,SymbolProperties *this,string *path)

{
  long lVar1;
  string local_30 [32];
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
  if (this->ReportPath == 0) {
    lVar1 = std::__cxx11::string::rfind((char *)__return_storage_ptr__,0x4ce833);
    if (lVar1 != -1) {
      std::__cxx11::string::substr((ulong)local_30,(ulong)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_30);
      std::__cxx11::string::~string(local_30);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SymbolProperties::GetFileName(const std::string &path) const
{
  std::string file(path);
  if (!this->ReportPath)
    {
    size_t at = file.rfind("/");
    if (at!=std::string::npos)
      {
      file = file.substr(at+1,std::string::npos);
      }
    }
  return file;
}